

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O0

MAP_TYPE * duckdb::ModeStandard<long>::CreateEmpty(Allocator *param_1)

{
  MAP_TYPE *__s;
  
  __s = (MAP_TYPE *)operator_new(0x38);
  memset(__s,0,0x38);
  std::
  unordered_map<long,_duckdb::ModeAttr,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_duckdb::ModeAttr>_>_>
  ::unordered_map((unordered_map<long,_duckdb::ModeAttr,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_duckdb::ModeAttr>_>_>
                   *)0xb16761);
  return __s;
}

Assistant:

static MAP_TYPE *CreateEmpty(Allocator &) {
		return new MAP_TYPE();
	}